

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O2

Aig_Obj_t * Ssw_ObjFrame_(Ssw_Frm_t *p,Aig_Obj_t *pObj,int i)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  
  uVar3 = i * p->nObjs;
  p_00 = p->vAig2Frm;
  iVar1 = pObj->Id;
  Vec_PtrFillExtra(p_00,uVar3 + iVar1 + 1,(void *)(ulong)uVar3);
  pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,uVar3 + iVar1);
  return pAVar2;
}

Assistant:

static inline Aig_Obj_t * Ssw_ObjFrame_( Ssw_Frm_t * p, Aig_Obj_t * pObj, int i )                       { return (Aig_Obj_t *)Vec_PtrGetEntry( p->vAig2Frm, p->nObjs*i+pObj->Id );     }